

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::
SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
::copy(SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *__ofirst;
  
  if (this->len == 0) {
    __ofirst = (span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *)
               0x0;
  }
  else {
    __ofirst = (span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *)
               BumpAllocator::allocate((BumpAllocator *)dst,this->len << 4,8);
    std::ranges::__uninitialized_copy_fn::
    operator()<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*,_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_*>
              ((__uninitialized_copy_fn *)&std::ranges::uninitialized_copy,this->data_,
               this->data_ + this->len,__ofirst,__ofirst + this->len);
  }
  return (int)__ofirst;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }